

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CaptureSourceAndGroups
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Recycler *recycler,Program *program,
          EncodedChar *body,CharCount bodyChars,CharCount bodyEncodedChars)

{
  char16 *buffer;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  DecodeOptions options;
  char16_t *pcVar5;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if ((program->source).ptr != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfa,"(program->source == 0)","program->source == 0");
    if (!bVar2) goto LAB_00ed4545;
    *puVar4 = 0;
  }
  if (body == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfb,"(body != 0)","body != 0");
    if (!bVar2) goto LAB_00ed4545;
    *puVar4 = 0;
  }
  local_70 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a7e1dbe;
  data.filename._0_4_ = 0xbfe;
  data.plusSize = (ulong)(bodyChars + 1);
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
  if (bodyChars == 0xffffffff) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pcVar5 = (char16_t *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)data._32_8_ = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00ed4545;
      *(undefined4 *)data._32_8_ = 0;
    }
    pcVar5 = (char16_t *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,(ulong)(bodyChars + 1) * 2);
    if (pcVar5 == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00ed4545;
      *puVar4 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)program);
  (program->source).ptr = pcVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(program);
  buffer = (program->source).ptr;
  options = (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions & ~doSecondSurrogatePair;
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions = options;
  local_70 = (undefined1  [8])body;
  utf8::DecodeUnitsInto(buffer,(LPCUTF8 *)local_70,body + bodyEncodedChars,options,(bool *)0x0);
  (program->source).ptr[bodyChars] = L'\0';
  program->sourceLen = bodyChars;
  if (this->nextGroupId < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc07,"(nextGroupId > 0)","nextGroupId > 0");
    if (!bVar2) {
LAB_00ed4545:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->nextGroupId < 0x8000) {
    program->numGroups = (Type)this->nextGroupId;
    return;
  }
  Js::JavascriptError::ThrowRangeError(this->scriptContext,-0x7ff5e9d5,(PCWSTR)0x0);
}

Assistant:

void Parser<P, IsLiteral>::CaptureSourceAndGroups(Recycler* recycler, Program* program, const EncodedChar* body, CharCount bodyChars, CharCount bodyEncodedChars)
    {
        Assert(program->source == 0);
        Assert(body != 0);

        // Program will own source string
        program->source = RecyclerNewArrayLeaf(recycler, Char, bodyChars + 1);
        // Don't need to zero out since we're writing to the buffer right here
        this->ConvertToUnicode(program->source, bodyChars, body, body + bodyEncodedChars);

        program->source[bodyChars] = 0;
        program->sourceLen = bodyChars;

        // We expect nextGroupId to be positive, because the full regexp itself always
        // counts as a capturing group.
        Assert(nextGroupId > 0);
        if (nextGroupId > MAX_NUM_GROUPS)
        {
            Js::JavascriptError::ThrowRangeError(this->scriptContext, JSERR_RegExpTooManyCapturingGroups);
        }
        else
        {
            program->numGroups = static_cast<uint16>(nextGroupId);
        }

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }